

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O3

int IDASensEEtolerances(void *ida_mem)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar1 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x727;
  }
  else {
    if (*(int *)((long)ida_mem + 0x6b4) != 0) {
      *(undefined4 *)((long)ida_mem + 0xec) = 4;
      return 0;
    }
    msgfmt = "Illegal attempt to call before calling IDASensInit.";
    iVar1 = -0x28;
    error_code = -0x28;
    line = 0x730;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDASensEEtolerances",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int IDASensEEtolerances(void* ida_mem)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Was sensitivity initialized? */

  if (IDA_mem->ida_sensMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_SENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    return (IDA_NO_SENS);
  }

  IDA_mem->ida_itolS = IDA_EE;

  return (IDA_SUCCESS);
}